

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLSafe.cxx
# Opt level: O2

ostream * operator<<(ostream *os,cmXMLSafe *self)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  byte *first;
  byte *last;
  uint ch;
  char buf [16];
  uint local_54;
  cmXMLSafe *local_50;
  char local_48 [24];
  
  last = (byte *)(self->Data + self->Size);
  first = (byte *)self->Data;
  local_50 = self;
  do {
    while( true ) {
      while( true ) {
        if (first == last) {
          return os;
        }
        pbVar3 = (byte *)cm_utf8_decode_character((char *)first,(char *)last,&local_54);
        if (pbVar3 != (byte *)0x0) break;
        bVar1 = *first;
        first = first + 1;
        local_54 = (uint)bVar1;
        sprintf(local_48,"%X");
        poVar4 = std::operator<<(os,"[NON-UTF-8-BYTE-0x");
        poVar4 = std::operator<<(poVar4,local_48);
        std::operator<<(poVar4,"]");
      }
      if (((local_54 - 0x10000 < 0x100000) || (local_54 - 0x20 < 0xd7e0)) ||
         (local_54 - 0xe000 < 0x1ffe)) break;
      if (local_54 - 9 < 2) {
LAB_002c7f77:
        std::ostream::write((char *)os,(long)first);
        first = pbVar3;
      }
      else {
        first = pbVar3;
        if (local_54 != 0xd) {
          sprintf(local_48,"%X");
          poVar4 = std::operator<<(os,"[NON-XML-CHAR-0x");
          poVar4 = std::operator<<(poVar4,local_48);
          pcVar6 = "]";
          goto LAB_002c7fd9;
        }
      }
    }
    poVar4 = os;
    if (local_54 == 0x22) {
      cVar2 = local_50->DoQuotes;
      pcVar6 = "\"";
      pcVar5 = "&quot;";
LAB_002c7fd2:
      if (cVar2 != '\0') {
        pcVar6 = pcVar5;
      }
    }
    else if (local_54 == 0x3e) {
      pcVar6 = "&gt;";
    }
    else {
      if (local_54 == 0x27) {
        cVar2 = local_50->DoQuotes;
        pcVar6 = "\'";
        pcVar5 = "&apos;";
        goto LAB_002c7fd2;
      }
      if (local_54 == 0x3c) {
        pcVar6 = "&lt;";
      }
      else {
        if (local_54 != 0x26) goto LAB_002c7f77;
        pcVar6 = "&amp;";
      }
    }
LAB_002c7fd9:
    std::operator<<(poVar4,pcVar6);
    first = pbVar3;
  } while( true );
}

Assistant:

std::ostream& operator<<(std::ostream& os, cmXMLSafe const& self)
{
  char const* first = self.Data;
  char const* last = self.Data + self.Size;
  while (first != last) {
    unsigned int ch;
    if (const char* next = cm_utf8_decode_character(first, last, &ch)) {
      // http://www.w3.org/TR/REC-xml/#NT-Char
      if ((ch >= 0x20 && ch <= 0xD7FF) || (ch >= 0xE000 && ch <= 0xFFFD) ||
          (ch >= 0x10000 && ch <= 0x10FFFF) || ch == 0x9 || ch == 0xA ||
          ch == 0xD) {
        switch (ch) {
          // Escape XML control characters.
          case '&':
            os << "&amp;";
            break;
          case '<':
            os << "&lt;";
            break;
          case '>':
            os << "&gt;";
            break;
          case '"':
            os << (self.DoQuotes ? "&quot;" : "\"");
            break;
          case '\'':
            os << (self.DoQuotes ? "&apos;" : "'");
            break;
          case '\r':
            break; // Ignore CR
          // Print the UTF-8 character.
          default:
            os.write(first, next - first);
            break;
        }
      } else {
        // Use a human-readable hex value for this invalid character.
        char buf[16];
        sprintf(buf, "%X", ch);
        os << "[NON-XML-CHAR-0x" << buf << "]";
      }

      first = next;
    } else {
      ch = static_cast<unsigned char>(*first++);
      // Use a human-readable hex value for this invalid byte.
      char buf[16];
      sprintf(buf, "%X", ch);
      os << "[NON-UTF-8-BYTE-0x" << buf << "]";
    }
  }
  return os;
}